

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O1

void BuildAddress(sockaddr_in *address,char *name)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  in_addr_t iVar4;
  char *pcVar5;
  FString FVar6;
  hostent *phVar7;
  int *piVar8;
  FString target;
  FString local_28;
  FString local_20;
  
  phVar7 = (hostent *)&local_28;
  local_28.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  address->sin_family = 2;
  pcVar5 = strchr(name,0x3a);
  if (pcVar5 == (char *)0x0) {
    FString::operator=(&local_28,name);
    uVar2 = DOOMPORT;
  }
  else {
    FString::FString(&local_20,name,(long)pcVar5 - (long)name);
    FString::operator=(&local_28,&local_20);
    FString::~FString(&local_20);
    iVar3 = atoi(pcVar5 + 1);
    uVar2 = (ushort)iVar3;
    if ((ushort)iVar3 == 0) {
      Printf("Weird port: %s (using %d)\n",pcVar5 + 1,(ulong)DOOMPORT);
      uVar2 = DOOMPORT;
    }
  }
  address->sin_port = uVar2 << 8 | uVar2 >> 8;
  cVar1 = *local_28.Chars;
  FVar6.Chars = local_28.Chars;
  do {
    if (cVar1 == '\0') {
      iVar4 = inet_addr(local_28.Chars);
      (address->sin_addr).s_addr = iVar4;
      pcVar5 = "Node number %d, address %s\n";
LAB_004be12f:
      Printf(pcVar5,(ulong)(uint)(int)doomcom.numnodes,phVar7->h_name);
      FString::~FString(&local_28);
      return;
    }
    FVar6.Chars = FVar6.Chars + 1;
    if (cVar1 != '.' && (byte)(cVar1 - 0x3aU) < 0xf6) {
      phVar7 = gethostbyname(local_28.Chars);
      FVar6.Chars = local_28.Chars;
      if (phVar7 == (hostent *)0x0) {
        piVar8 = __errno_location();
        pcVar5 = strerror(*piVar8);
        I_FatalError("gethostbyname: couldn\'t find %s\n%s",FVar6.Chars,pcVar5);
      }
      (address->sin_addr).s_addr = *(in_addr_t *)*phVar7->h_addr_list;
      pcVar5 = "Node number %d, hostname %s\n";
      goto LAB_004be12f;
    }
    cVar1 = *FVar6.Chars;
  } while( true );
}

Assistant:

void BuildAddress (sockaddr_in *address, const char *name)
{
	hostent *hostentry;		// host information entry
	u_short port;
	const char *portpart;
	bool isnamed = false;
	int curchar;
	char c;
	FString target;

	address->sin_family = AF_INET;

	if ( (portpart = strchr (name, ':')) )
	{
		target = FString(name, portpart - name);
		port = atoi (portpart + 1);
		if (!port)
		{
			Printf ("Weird port: %s (using %d)\n", portpart + 1, DOOMPORT);
			port = DOOMPORT;
		}
	}
	else
	{
		target = name;
		port = DOOMPORT;
	}
	address->sin_port = htons(port);

	for (curchar = 0; (c = target[curchar]) ; curchar++)
	{
		if ((c < '0' || c > '9') && c != '.')
		{
			isnamed = true;
			break;
		}
	}

	if (!isnamed)
	{
		address->sin_addr.s_addr = inet_addr (target);
		Printf ("Node number %d, address %s\n", doomcom.numnodes, target.GetChars());
	}
	else
	{
		hostentry = gethostbyname (target);
		if (!hostentry)
			I_FatalError ("gethostbyname: couldn't find %s\n%s", target.GetChars(), neterror());
		address->sin_addr.s_addr = *(int *)hostentry->h_addr_list[0];
		Printf ("Node number %d, hostname %s\n",
			doomcom.numnodes, hostentry->h_name);
	}
}